

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_0::IsExplicitLod(Op opcode)

{
  if (((6 < opcode - OpImageSampleExplicitLod) ||
      ((0x55U >> (opcode - OpImageSampleExplicitLod & 0x1f) & 1) == 0)) &&
     ((6 < opcode - OpImageSparseSampleExplicitLod ||
      ((0x55U >> (opcode - OpImageSparseSampleExplicitLod & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool IsExplicitLod(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpImageSampleExplicitLod:
    case spv::Op::OpImageSampleDrefExplicitLod:
    case spv::Op::OpImageSampleProjExplicitLod:
    case spv::Op::OpImageSampleProjDrefExplicitLod:
    case spv::Op::OpImageSparseSampleExplicitLod:
    case spv::Op::OpImageSparseSampleDrefExplicitLod:
    case spv::Op::OpImageSparseSampleProjExplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefExplicitLod:
      return true;
    default:
      break;
  }
  return false;
}